

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::functype<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  bool bVar1;
  Ok *pOVar2;
  unsigned_long *puVar3;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Ok local_172;
  allocator<char> local_171;
  string local_170;
  Err local_150;
  Err local_130;
  Err *local_110;
  Err *err_1;
  MaybeResult<unsigned_long> _val_1;
  MaybeResult<unsigned_long> parsedResults;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  MaybeResult<wasm::Ok> _val;
  MaybeResult<wasm::Ok> parsedParams;
  ParseDeclsCtx *ctx_local;
  
  expected = sv("func",4);
  bVar1 = Lexer::takeSExprStart(&ctx->in,expected);
  if (bVar1) {
    __return_storage_ptr___00 =
         (__index_type *)
         ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20);
    params<wasm::WATParser::ParseDeclsCtx>
              ((MaybeResult<wasm::Ok> *)__return_storage_ptr___00,ctx,true);
    MaybeResult<wasm::Ok>::MaybeResult
              ((MaybeResult<wasm::Ok> *)local_78,(MaybeResult<wasm::Ok> *)__return_storage_ptr___00)
    ;
    local_90 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)local_78);
    bVar1 = local_90 == (Err *)0x0;
    if (!bVar1) {
      wasm::Err::Err(&local_b0,local_90);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_b0);
      wasm::Err::~Err(&local_b0);
    }
    MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)local_78);
    if (bVar1) {
      results<wasm::WATParser::ParseDeclsCtx>
                ((MaybeResult<unsigned_long> *)
                 ((long)&_val_1.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20),ctx);
      MaybeResult<unsigned_long>::MaybeResult
                ((MaybeResult<unsigned_long> *)&err_1,
                 (MaybeResult<unsigned_long> *)
                 ((long)&_val_1.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20));
      local_110 = MaybeResult<unsigned_long>::getErr((MaybeResult<unsigned_long> *)&err_1);
      bVar1 = local_110 == (Err *)0x0;
      if (!bVar1) {
        wasm::Err::Err(&local_130,local_110);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_130);
        wasm::Err::~Err(&local_130);
      }
      MaybeResult<unsigned_long>::~MaybeResult((MaybeResult<unsigned_long> *)&err_1);
      if (bVar1) {
        bVar1 = Lexer::takeRParen(&ctx->in);
        if (bVar1) {
          pOVar2 = MaybeResult<wasm::Ok>::getPtr
                             ((MaybeResult<wasm::Ok> *)
                              ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20
                              ));
          puVar3 = MaybeResult<unsigned_long>::getPtr
                             ((MaybeResult<unsigned_long> *)
                              ((long)&_val_1.val.
                                      super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                                      super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>
                                      .super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                      super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> +
                              0x20));
          NullTypeParserCtx::makeFuncType((NullTypeParserCtx *)ctx,pOVar2,puVar3);
          MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_172);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_170,"expected end of functype",&local_171);
          Lexer::err(&local_150,&ctx->in,&local_170);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_150);
          wasm::Err::~Err(&local_150);
          std::__cxx11::string::~string((string *)&local_170);
          std::allocator<char>::~allocator(&local_171);
        }
      }
      MaybeResult<unsigned_long>::~MaybeResult
                ((MaybeResult<unsigned_long> *)
                 ((long)&_val_1.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20));
    }
    MaybeResult<wasm::Ok>::~MaybeResult
              ((MaybeResult<wasm::Ok> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
  }
  else {
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::SignatureT> functype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("func"sv)) {
    return {};
  }

  auto parsedParams = params(ctx);
  CHECK_ERR(parsedParams);

  auto parsedResults = results(ctx);
  CHECK_ERR(parsedResults);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of functype");
  }

  return ctx.makeFuncType(parsedParams.getPtr(), parsedResults.getPtr());
}